

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_offset_access_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  fdb_kvs_handle *pfVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  fdb_iterator **ptr_iterator;
  fdb_config *pfVar7;
  int iVar8;
  int delete_opt;
  fdb_doc **unaff_RBP;
  char *pcVar9;
  fdb_kvs_handle *unaff_R12;
  ulong uVar10;
  char *unaff_R14;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_doc *rdoc;
  fdb_kvs_handle *o_db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_2f00;
  fdb_kvs_handle *pfStack_2ef8;
  fdb_file_handle *pfStack_2ef0;
  fdb_doc *pfStack_2ee8;
  fdb_kvs_config fStack_2ee0;
  timeval tStack_2ec8;
  fdb_config fStack_2eb8;
  fdb_config *pfStack_2dc0;
  fdb_iterator *pfStack_2da8;
  fdb_kvs_handle *pfStack_2da0;
  fdb_doc *pfStack_2d98;
  fdb_file_handle *pfStack_2d90;
  fdb_kvs_config fStack_2d88;
  timeval tStack_2d70;
  fdb_config fStack_2d60;
  fdb_config *pfStack_2c68;
  fdb_iterator *pfStack_2c50;
  fdb_kvs_handle *pfStack_2c48;
  fdb_file_handle *pfStack_2c40;
  fdb_doc *pfStack_2c38;
  uint64_t uStack_2c30;
  undefined1 uStack_2c28;
  undefined7 uStack_2c20;
  undefined4 uStack_2c19;
  undefined8 uStack_2c10;
  undefined7 uStack_2c08;
  undefined4 uStack_2c01;
  fdb_kvs_config fStack_2bf8;
  timeval tStack_2be0;
  undefined4 uStack_2bd0;
  undefined1 uStack_2bcc;
  fdb_config fStack_2ac8;
  char acStack_29d0 [256];
  fdb_config *pfStack_28d0;
  fdb_iterator **ppfStack_28c8;
  code *pcStack_28c0;
  fdb_doc *pfStack_28a8;
  fdb_iterator *pfStack_28a0;
  fdb_kvs_handle *pfStack_2898;
  fdb_file_handle *pfStack_2890;
  fdb_kvs_config fStack_2888;
  timeval tStack_2870;
  fdb_config fStack_2860;
  fdb_iterator **ppfStack_2768;
  fdb_iterator *pfStack_2750;
  fdb_doc *pfStack_2748;
  fdb_kvs_handle *pfStack_2740;
  fdb_file_handle *pfStack_2738;
  timeval tStack_2730;
  undefined2 uStack_2720;
  undefined6 uStack_271e;
  fdb_kvs_config fStack_2618;
  char acStack_2600 [264];
  fdb_config fStack_24f8;
  char acStack_2400 [256];
  fdb_kvs_handle *pfStack_2300;
  fdb_kvs_handle *pfStack_22f8;
  fdb_doc **ppfStack_22f0;
  fdb_doc **ppfStack_22e8;
  fdb_doc **ppfStack_22e0;
  fdb_kvs_handle *local_22c8;
  fdb_file_handle *local_22c0;
  fdb_iterator *local_22b8;
  fdb_doc *local_22b0;
  fdb_kvs_handle *local_22a8;
  fdb_kvs_config local_22a0;
  timeval local_2288;
  fdb_doc *local_2278 [32];
  undefined1 local_2178 [272];
  uint8_t local_2068 [20];
  undefined4 local_2054;
  undefined4 local_204c;
  undefined1 local_2042;
  fdb_doc *apfStack_1f78 [500];
  fdb_kvs_handle local_fd8 [7];
  
  ppfStack_22e0 = (fdb_doc **)0x11b4e7;
  gettimeofday(&local_2288,(__timezone_ptr_t)0x0);
  ppfStack_22e0 = (fdb_doc **)0x11b4ec;
  memleak_start();
  local_22b0 = (fdb_doc *)0x0;
  ppfStack_22e0 = (fdb_doc **)0x11b501;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar3 = (fdb_kvs_handle *)(local_2178 + 0x108);
  ppfStack_22e0 = (fdb_doc **)0x11b511;
  fdb_get_default_config();
  ppfStack_22e0 = (fdb_doc **)0x11b51b;
  fdb_get_default_kvs_config();
  local_2068[8] = '\0';
  local_2068[9] = '\x02';
  local_2068[10] = '\0';
  local_2068[0xb] = '\0';
  local_2068[0xc] = '\0';
  local_2068[0xd] = '\0';
  local_2068[0xe] = '\0';
  local_2068[0xf] = '\0';
  local_2068[0] = '\0';
  local_2068[1] = '\x10';
  local_2068[2] = '\0';
  local_2068[3] = '\0';
  local_2068[4] = '\0';
  local_2068[5] = '\0';
  local_2068[6] = '\0';
  local_2068[7] = '\0';
  local_204c = 1;
  local_2042 = 0;
  local_2054 = 1;
  ppfStack_22e0 = (fdb_doc **)0x11b54e;
  fVar2 = fdb_open(&local_22c0,"./iterator_test1",(fdb_config *)pfVar3);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9fd;
  ppfStack_22e0 = (fdb_doc **)0x11b571;
  fVar2 = fdb_kvs_open(local_22c0,&local_22c8,"DB",&local_22a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba02;
  ppfStack_22e0 = (fdb_doc **)0x11b594;
  fVar2 = fdb_kvs_open(local_22c0,&local_22a8,"ODB",&local_22a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba07;
  unaff_R14 = (char *)local_2278;
  unaff_R12 = (fdb_kvs_handle *)local_2178;
  unaff_R15 = (char *)0x0;
  uVar10 = 0;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b5c3;
    sprintf(unaff_R14,"key%d",uVar10 & 0xffffffff);
    ppfStack_22e0 = (fdb_doc **)0x11b5d7;
    sprintf((char *)unaff_R12,"body%d",uVar10 & 0xffffffff);
    unaff_RBP = (fdb_doc **)((long)apfStack_1f78 + (long)unaff_R15);
    ppfStack_22e0 = (fdb_doc **)0x11b5ea;
    pfVar3 = (fdb_kvs_handle *)strlen(unaff_R14);
    ppfStack_22e0 = (fdb_doc **)0x11b5f5;
    sVar4 = strlen((char *)unaff_R12);
    ppfStack_22e0 = (fdb_doc **)0x11b60f;
    fdb_doc_create(unaff_RBP,unaff_R14,(size_t)pfVar3,(void *)0x0,0,unaff_R12,sVar4);
    ppfStack_22e0 = (fdb_doc **)0x11b621;
    fVar2 = fdb_set(local_22c8,apfStack_1f78[uVar10]);
    pfVar1 = local_22a8;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011b9d0:
      ppfStack_22e0 = (fdb_doc **)0x11b9d5;
      iterator_offset_access_test();
      goto LAB_0011b9d5;
    }
    ppfStack_22e0 = (fdb_doc **)0x11b636;
    sVar4 = strlen(unaff_R14);
    ppfStack_22e0 = (fdb_doc **)0x11b656;
    fVar2 = fdb_set_kv(pfVar1,unaff_R14,sVar4,&apfStack_1f78[uVar10]->offset,8);
    pfVar3 = pfVar1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      ppfStack_22e0 = (fdb_doc **)0x11b9d0;
      iterator_offset_access_test();
      goto LAB_0011b9d0;
    }
    uVar10 = uVar10 + 1;
    unaff_R15 = (char *)((long)unaff_R15 + 8);
  } while (uVar10 != 1000);
  ppfStack_22e0 = (fdb_doc **)0x11b681;
  fVar2 = fdb_commit(local_22c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba0c;
  pfVar3 = (fdb_kvs_handle *)0xfa;
  unaff_R14 = "key%d";
  unaff_R15 = (char *)local_2278;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b6a9;
    sprintf(unaff_R15,"key%d",pfVar3);
    unaff_R12 = local_22c8;
    ppfStack_22e0 = (fdb_doc **)0x11b6b6;
    sVar4 = strlen(unaff_R15);
    ppfStack_22e0 = (fdb_doc **)0x11b6c4;
    fVar2 = fdb_del_kv(unaff_R12,unaff_R15,sVar4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9d5;
    uVar5 = (int)pfVar3 + 1;
    pfVar3 = (fdb_kvs_handle *)(ulong)uVar5;
  } while (uVar5 != 500);
  unaff_R14 = (char *)local_2278;
  unaff_R12 = (fdb_kvs_handle *)local_2178;
  unaff_R15 = (char *)0x0;
  uVar10 = 0;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b6fd;
    sprintf(unaff_R14,"k0y%d",uVar10 & 0xffffffff);
    ppfStack_22e0 = (fdb_doc **)0x11b711;
    sprintf((char *)unaff_R12,"b0dy%d",uVar10 & 0xffffffff);
    unaff_RBP = (fdb_doc **)((long)apfStack_1f78 + (long)unaff_R15);
    ppfStack_22e0 = (fdb_doc **)0x11b729;
    fdb_doc_free(apfStack_1f78[uVar10]);
    ppfStack_22e0 = (fdb_doc **)0x11b731;
    pfVar3 = (fdb_kvs_handle *)strlen(unaff_R14);
    ppfStack_22e0 = (fdb_doc **)0x11b73c;
    sVar4 = strlen((char *)unaff_R12);
    ppfStack_22e0 = (fdb_doc **)0x11b756;
    fdb_doc_create(unaff_RBP,unaff_R14,(size_t)pfVar3,(void *)0x0,0,unaff_R12,sVar4);
    ppfStack_22e0 = (fdb_doc **)0x11b768;
    fVar2 = fdb_set(local_22c8,apfStack_1f78[uVar10]);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9da;
    uVar10 = uVar10 + 1;
    unaff_R15 = (char *)((long)unaff_R15 + 8);
  } while (uVar10 != 0xfa);
  ppfStack_22e0 = (fdb_doc **)0x11b790;
  fVar2 = fdb_commit(local_22c0,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba11;
  ppfStack_22e0 = (fdb_doc **)0x11b7b8;
  fdb_iterator_init(local_22a8,&local_22b8,(void *)0x0,0,(void *)0x0,0,2);
  unaff_R15 = (char *)0x1ea;
  pfVar3 = local_fd8;
  unaff_R14 = (char *)&local_22b0;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b7d8;
    fVar2 = fdb_get_byoffset(local_22c8,*(fdb_doc **)&pfVar3->kvs_config);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9e4;
    ppfStack_22e0 = (fdb_doc **)0x11b7f6;
    fVar2 = fdb_iterator_seek(local_22b8,(void *)(*(size_t **)&pfVar3->kvs_config)[4],
                              **(size_t **)&pfVar3->kvs_config,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9df;
    ppfStack_22e0 = (fdb_doc **)0x11b80b;
    fVar2 = fdb_iterator_get(local_22b8,(fdb_doc **)unaff_R14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9ee;
    if (*local_22b0->body != *(long *)(*(long *)&pfVar3->kvs_config + 0x30)) {
      ppfStack_22e0 = (fdb_doc **)0x11b86c;
      iterator_offset_access_test();
    }
    ppfStack_22e0 = (fdb_doc **)0x11b835;
    fVar2 = fdb_del(local_22c8,*(fdb_doc **)&pfVar3->kvs_config);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9e9;
    ppfStack_22e0 = (fdb_doc **)0x11b84a;
    fdb_get_metaonly(local_22c8,*(fdb_doc **)&pfVar3->kvs_config);
    unaff_R15 = (char *)((long)unaff_R15 + 10);
    pfVar3 = (fdb_kvs_handle *)&pfVar3->dhandle;
  } while (unaff_R15 < (fdb_doc **)0x3de);
  ppfStack_22e0 = (fdb_doc **)0x11b878;
  fdb_iterator_close(local_22b8);
  ppfStack_22e0 = (fdb_doc **)0x11b887;
  fVar2 = fdb_commit(local_22c0,'\x01');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R14 = (char *)local_2278;
    unaff_R15 = "b1dy%d";
    unaff_R12 = (fdb_kvs_handle *)local_2178;
    unaff_RBP = (fdb_doc **)0x0;
    do {
      ppfStack_22e0 = (fdb_doc **)0x11b8b8;
      sprintf(unaff_R14,"k1y%d",unaff_RBP);
      ppfStack_22e0 = (fdb_doc **)0x11b8c7;
      sprintf((char *)unaff_R12,"b1dy%d",unaff_RBP);
      pfVar1 = local_22c8;
      ppfStack_22e0 = (fdb_doc **)0x11b8d4;
      pfVar3 = (fdb_kvs_handle *)strlen(unaff_R14);
      ppfStack_22e0 = (fdb_doc **)0x11b8df;
      sVar4 = strlen((char *)unaff_R12);
      ppfStack_22e0 = (fdb_doc **)0x11b8f3;
      fVar2 = fdb_set_kv(pfVar1,unaff_R14,(size_t)pfVar3,unaff_R12,sVar4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b9f3;
      uVar5 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_doc **)(ulong)uVar5;
    } while (uVar5 != 0xfa);
    unaff_R14 = (char *)0x1ea;
    pfVar3 = local_fd8;
    while( true ) {
      ppfStack_22e0 = (fdb_doc **)0x11b920;
      fVar2 = fdb_get_byoffset(local_22c8,*(fdb_doc **)&pfVar3->kvs_config);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) break;
      if (*(char *)(*(long *)&pfVar3->kvs_config + 0x48) == '\0') {
        ppfStack_22e0 = (fdb_doc **)0x11b94d;
        iterator_offset_access_test();
      }
      unaff_R14 = (char *)((long)unaff_R14 + 10);
      pfVar3 = (fdb_kvs_handle *)&pfVar3->dhandle;
      if ((fdb_doc **)0x3dd < unaff_R14) {
        lVar6 = 0;
        do {
          ppfStack_22e0 = (fdb_doc **)0x11b95e;
          fdb_doc_free(apfStack_1f78[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 1000);
        ppfStack_22e0 = (fdb_doc **)0x11b974;
        fdb_doc_free(local_22b0);
        ppfStack_22e0 = (fdb_doc **)0x11b97e;
        fdb_close(local_22c0);
        ppfStack_22e0 = (fdb_doc **)0x11b983;
        fdb_shutdown();
        ppfStack_22e0 = (fdb_doc **)0x11b988;
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (iterator_offset_access_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        ppfStack_22e0 = (fdb_doc **)0x11b9b9;
        fprintf(_stderr,pcVar9,"iterator offset access test");
        return;
      }
    }
    goto LAB_0011b9f8;
  }
  goto LAB_0011ba16;
LAB_0011b9d5:
  ppfStack_22e0 = (fdb_doc **)0x11b9da;
  iterator_offset_access_test();
LAB_0011b9da:
  ppfStack_22e0 = (fdb_doc **)0x11b9df;
  iterator_offset_access_test();
LAB_0011b9df:
  ppfStack_22e0 = (fdb_doc **)0x11b9e4;
  iterator_offset_access_test();
LAB_0011b9e4:
  ppfStack_22e0 = (fdb_doc **)0x11b9e9;
  iterator_offset_access_test();
LAB_0011b9e9:
  ppfStack_22e0 = (fdb_doc **)0x11b9ee;
  iterator_offset_access_test();
LAB_0011b9ee:
  ppfStack_22e0 = (fdb_doc **)0x11b9f3;
  iterator_offset_access_test();
LAB_0011b9f3:
  ppfStack_22e0 = (fdb_doc **)0x11b9f8;
  iterator_offset_access_test();
LAB_0011b9f8:
  ppfStack_22e0 = (fdb_doc **)0x11b9fd;
  iterator_offset_access_test();
LAB_0011b9fd:
  ppfStack_22e0 = (fdb_doc **)0x11ba02;
  iterator_offset_access_test();
LAB_0011ba02:
  ppfStack_22e0 = (fdb_doc **)0x11ba07;
  iterator_offset_access_test();
LAB_0011ba07:
  ppfStack_22e0 = (fdb_doc **)0x11ba0c;
  iterator_offset_access_test();
LAB_0011ba0c:
  ppfStack_22e0 = (fdb_doc **)0x11ba11;
  iterator_offset_access_test();
LAB_0011ba11:
  ppfStack_22e0 = (fdb_doc **)0x11ba16;
  iterator_offset_access_test();
LAB_0011ba16:
  ppfStack_22e0 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_2768 = (fdb_iterator **)0x11ba36;
  pfStack_2300 = pfVar3;
  pfStack_22f8 = unaff_R12;
  ppfStack_22f0 = (fdb_doc **)unaff_R14;
  ppfStack_22e8 = (fdb_doc **)unaff_R15;
  ppfStack_22e0 = unaff_RBP;
  gettimeofday(&tStack_2730,(__timezone_ptr_t)0x0);
  ppfStack_2768 = (fdb_iterator **)0x11ba3b;
  memleak_start();
  ppfStack_2768 = (fdb_iterator **)0x11ba4b;
  fdb_get_default_config();
  fStack_24f8.buffercache_size = 0;
  ppfStack_2768 = (fdb_iterator **)0x11ba63;
  fdb_get_default_kvs_config();
  ppfStack_2768 = (fdb_iterator **)0x11ba86;
  sprintf(acStack_2600,"rm -rf  %s*","./dummy");
  ppfStack_2768 = (fdb_iterator **)0x11ba8e;
  system(acStack_2600);
  ppfStack_2768 = (fdb_iterator **)0x11baa1;
  fdb_open(&pfStack_2738,"./dummy",&fStack_24f8);
  ppfStack_2768 = (fdb_iterator **)0x11bab4;
  fdb_kvs_open(pfStack_2738,&pfStack_2740,(char *)0x0,&fStack_2618);
  uVar10 = 0;
  do {
    ppfStack_2768 = (fdb_iterator **)0x11bae0;
    sprintf((char *)&uStack_2720,"k%06d\n",uVar10);
    ppfStack_2768 = (fdb_iterator **)0x11baef;
    sprintf(acStack_2400,"v%06d\n",uVar10);
    ppfStack_2768 = (fdb_iterator **)0x11bb0a;
    fdb_set_kv(pfStack_2740,&uStack_2720,8,acStack_2400,8);
    uVar5 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar5;
  } while (uVar5 != 3);
  ppfStack_2768 = (fdb_iterator **)0x11bb2c;
  sprintf((char *)&uStack_2720,"k%06d\n",1);
  ppfStack_2768 = (fdb_iterator **)0x11bb3e;
  fdb_del_kv(pfStack_2740,&uStack_2720,8);
  ppfStack_2768 = (fdb_iterator **)0x11bb4a;
  fdb_commit(pfStack_2738,'\0');
  uStack_2720 = 0x61;
  acStack_2600[0] = 'z';
  acStack_2600[1] = '\0';
  ppfStack_2768 = (fdb_iterator **)0x11bb81;
  fVar2 = fdb_iterator_init(pfStack_2740,&pfStack_2750,&uStack_2720,1,acStack_2600,1,2);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_2768 = (fdb_iterator **)0x11bb93;
    fVar2 = fdb_iterator_seek_to_max(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdbc;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11bbb1;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdc1;
    ppfStack_2768 = (fdb_iterator **)0x11bbd4;
    sprintf((char *)&uStack_2720,"k%06d\n",2);
    if (*pfStack_2748->key != CONCAT62(uStack_271e,uStack_2720)) goto LAB_0011bdc6;
    ppfStack_2768 = (fdb_iterator **)0x11bbee;
    fdb_doc_free(pfStack_2748);
    ppfStack_2768 = (fdb_iterator **)0x11bbf8;
    fVar2 = fdb_iterator_prev(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdd0;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11bc16;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdd5;
    ppfStack_2768 = (fdb_iterator **)0x11bc36;
    sprintf((char *)&uStack_2720,"k%06d\n",0);
    if (*pfStack_2748->key != CONCAT62(uStack_271e,uStack_2720)) goto LAB_0011bdda;
    ppfStack_2768 = (fdb_iterator **)0x11bc50;
    fdb_doc_free(pfStack_2748);
    ptr_iterator = &pfStack_2750;
    ppfStack_2768 = (fdb_iterator **)0x11bc5d;
    fdb_iterator_close(pfStack_2750);
    ppfStack_2768 = (fdb_iterator **)0x11bc89;
    fVar2 = fdb_iterator_init(pfStack_2740,ptr_iterator,&uStack_2720,1,acStack_2600,1,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bde4;
    ppfStack_2768 = (fdb_iterator **)0x11bc9b;
    fVar2 = fdb_iterator_seek_to_min(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bde9;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11bcb9;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdee;
    ptr_iterator = (fdb_iterator **)&uStack_2720;
    ppfStack_2768 = (fdb_iterator **)0x11bcd9;
    sprintf((char *)ptr_iterator,"k%06d\n",0);
    if (*pfStack_2748->key != CONCAT62(uStack_271e,uStack_2720)) goto LAB_0011bdf3;
    ppfStack_2768 = (fdb_iterator **)0x11bcf3;
    fdb_doc_free(pfStack_2748);
    ppfStack_2768 = (fdb_iterator **)0x11bcfd;
    fVar2 = fdb_iterator_next(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bdfd;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11bd1b;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be02;
    ptr_iterator = (fdb_iterator **)&uStack_2720;
    ppfStack_2768 = (fdb_iterator **)0x11bd3e;
    sprintf((char *)ptr_iterator,"k%06d\n",2);
    if (*pfStack_2748->key == CONCAT62(uStack_271e,uStack_2720)) {
      ppfStack_2768 = (fdb_iterator **)0x11bd58;
      fdb_doc_free(pfStack_2748);
      ppfStack_2768 = (fdb_iterator **)0x11bd62;
      fdb_iterator_close(pfStack_2750);
      ppfStack_2768 = (fdb_iterator **)0x11bd6c;
      fdb_close(pfStack_2738);
      ppfStack_2768 = (fdb_iterator **)0x11bd71;
      fdb_shutdown();
      ppfStack_2768 = (fdb_iterator **)0x11bd76;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      ppfStack_2768 = (fdb_iterator **)0x11bda7;
      fprintf(_stderr,pcVar9,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_2768 = (fdb_iterator **)0x11bdbc;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdbc:
    ppfStack_2768 = (fdb_iterator **)0x11bdc1;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc1:
    ppfStack_2768 = (fdb_iterator **)0x11bdc6;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc6:
    ppfStack_2768 = (fdb_iterator **)0x11bdd0;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd0:
    ppfStack_2768 = (fdb_iterator **)0x11bdd5;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd5:
    ppfStack_2768 = (fdb_iterator **)0x11bdda;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdda:
    ptr_iterator = (fdb_iterator **)&uStack_2720;
    ppfStack_2768 = (fdb_iterator **)0x11bde4;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde4:
    ppfStack_2768 = (fdb_iterator **)0x11bde9;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde9:
    ppfStack_2768 = (fdb_iterator **)0x11bdee;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdee:
    ppfStack_2768 = (fdb_iterator **)0x11bdf3;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdf3:
    ppfStack_2768 = (fdb_iterator **)0x11bdfd;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdfd:
    ppfStack_2768 = (fdb_iterator **)0x11be02;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011be02:
    ppfStack_2768 = (fdb_iterator **)0x11be07;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_2768 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_28c0 = (code *)0x11be25;
  ppfStack_2768 = ptr_iterator;
  gettimeofday(&tStack_2870,(__timezone_ptr_t)0x0);
  pfStack_28a8 = (fdb_doc *)0x0;
  pcStack_28c0 = (code *)0x11be33;
  memleak_start();
  pfVar7 = &fStack_2860;
  pcStack_28c0 = (code *)0x11be40;
  fdb_get_default_config();
  pcStack_28c0 = (code *)0x11be4a;
  fdb_get_default_kvs_config();
  pcStack_28c0 = (code *)0x11be56;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_28c0 = (code *)0x11be6a;
  fVar2 = fdb_open(&pfStack_2890,"./iterator_test1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_28c0 = (code *)0x11be86;
    fVar2 = fdb_kvs_open_default(pfStack_2890,&pfStack_2898,&fStack_2888);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c091;
    pcStack_28c0 = (code *)0x11bea9;
    fdb_set_kv(pfStack_2898,"a",1,(void *)0x0,0);
    pfVar7 = (fdb_config *)0x155b95;
    pcStack_28c0 = (code *)0x11bec7;
    fdb_set_kv(pfStack_2898,"b",1,(void *)0x0,0);
    pcStack_28c0 = (code *)0x11bee2;
    fdb_set_kv(pfStack_2898,"c",1,(void *)0x0,0);
    pcStack_28c0 = (code *)0x11bf06;
    fVar2 = fdb_iterator_init(pfStack_2898,&pfStack_28a0,"b",1,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c098;
    pcStack_28c0 = (code *)0x11bf18;
    fVar2 = fdb_iterator_seek_to_min(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c09d;
    pcStack_28c0 = (code *)0x11bf2f;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0a4;
    if (*pfStack_28a8->key != 'b') goto LAB_0011c0ab;
    pcStack_28c0 = (code *)0x11bf4e;
    fdb_doc_free(pfStack_28a8);
    pfStack_28a8 = (fdb_doc *)0x0;
    pcStack_28c0 = (code *)0x11bf61;
    fVar2 = fdb_iterator_seek_to_max(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0b3;
    pcStack_28c0 = (code *)0x11bf78;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ba;
    if (*pfStack_28a8->key != 'c') goto LAB_0011c0c1;
    pcStack_28c0 = (code *)0x11bf97;
    fdb_doc_free(pfStack_28a8);
    pfStack_28a8 = (fdb_doc *)0x0;
    pcStack_28c0 = (code *)0x11bfaa;
    fVar2 = fdb_iterator_prev(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0c9;
    pcStack_28c0 = (code *)0x11bfc1;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0d0;
    if (*pfStack_28a8->key != 'b') goto LAB_0011c0d7;
    pcStack_28c0 = (code *)0x11bfe0;
    fdb_doc_free(pfStack_28a8);
    pfStack_28a8 = (fdb_doc *)0x0;
    pcStack_28c0 = (code *)0x11bff3;
    fVar2 = fdb_iterator_next(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    pcStack_28c0 = (code *)0x11c00a;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e6;
    if (*pfStack_28a8->key == 'c') {
      pcStack_28c0 = (code *)0x11c029;
      fdb_doc_free(pfStack_28a8);
      pfStack_28a8 = (fdb_doc *)0x0;
      pcStack_28c0 = (code *)0x11c03c;
      fdb_iterator_close(pfStack_28a0);
      pcStack_28c0 = (code *)0x11c046;
      fdb_close(pfStack_2890);
      pcStack_28c0 = (code *)0x11c04b;
      fdb_shutdown();
      pcStack_28c0 = (code *)0x11c050;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_28c0 = (code *)0x11c081;
      fprintf(_stderr,pcVar9,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_28c0 = (code *)0x11c091;
    iterator_uncommited_seeks();
LAB_0011c091:
    pcStack_28c0 = (code *)0x11c098;
    iterator_uncommited_seeks();
LAB_0011c098:
    pcStack_28c0 = (code *)0x11c09d;
    iterator_uncommited_seeks();
LAB_0011c09d:
    pcStack_28c0 = (code *)0x11c0a4;
    iterator_uncommited_seeks();
LAB_0011c0a4:
    pcStack_28c0 = (code *)0x11c0ab;
    iterator_uncommited_seeks();
LAB_0011c0ab:
    pcStack_28c0 = (code *)0x11c0b3;
    iterator_uncommited_seeks();
LAB_0011c0b3:
    pcStack_28c0 = (code *)0x11c0ba;
    iterator_uncommited_seeks();
LAB_0011c0ba:
    pcStack_28c0 = (code *)0x11c0c1;
    iterator_uncommited_seeks();
LAB_0011c0c1:
    pcStack_28c0 = (code *)0x11c0c9;
    iterator_uncommited_seeks();
LAB_0011c0c9:
    pcStack_28c0 = (code *)0x11c0d0;
    iterator_uncommited_seeks();
LAB_0011c0d0:
    pcStack_28c0 = (code *)0x11c0d7;
    iterator_uncommited_seeks();
LAB_0011c0d7:
    pcStack_28c0 = (code *)0x11c0df;
    iterator_uncommited_seeks();
LAB_0011c0df:
    pcStack_28c0 = (code *)0x11c0e6;
    iterator_uncommited_seeks();
LAB_0011c0e6:
    pcStack_28c0 = (code *)0x11c0ed;
    iterator_uncommited_seeks();
  }
  pcStack_28c0 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_2c68 = (fdb_config *)0x11c10f;
  pfStack_28d0 = pfVar7;
  ppfStack_28c8 = (fdb_iterator **)&uStack_2720;
  pcStack_28c0 = (code *)uVar10;
  gettimeofday(&tStack_2be0,(__timezone_ptr_t)0x0);
  pfStack_2c68 = (fdb_config *)0x11c114;
  memleak_start();
  pfVar7 = &fStack_2ac8;
  pfStack_2c68 = (fdb_config *)0x11c124;
  fdb_get_default_config();
  fStack_2ac8.buffercache_size = 0;
  pfStack_2c68 = (fdb_config *)0x11c136;
  fdb_get_default_kvs_config();
  pfStack_2c68 = (fdb_config *)0x11c156;
  sprintf(acStack_29d0,"rm -rf  %s*","./iterator_test");
  pfStack_2c68 = (fdb_config *)0x11c15e;
  system(acStack_29d0);
  pfStack_2c68 = (fdb_config *)0x11c172;
  fVar2 = fdb_open(&pfStack_2c40,"./iterator_test1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_2c68 = (fdb_config *)0x11c190;
    fVar2 = fdb_kvs_open(pfStack_2c40,&pfStack_2c48,(char *)0x0,&fStack_2bf8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c32a;
    uStack_2c08 = 0x34323634353773;
    uStack_2c01 = 0xff;
    uStack_2c20 = 0x34323634353773;
    uStack_2c19 = 0x10000ff;
    uStack_2c10._0_4_ = 0x34353773;
    uStack_2c10._4_1_ = true;
    uStack_2c10._5_1_ = true;
    uStack_2c10._6_1_ = '4';
    uStack_2c10._7_1_ = 0xff;
    uStack_2c30 = 0xff34323634353773;
    uStack_2c28 = 0xff;
    uStack_2bd0 = 0x3179656b;
    uStack_2bcc = 0;
    pfStack_2c68 = (fdb_config *)0x11c1f4;
    fVar2 = fdb_set_kv(pfStack_2c48,&uStack_2c08,0xb,&uStack_2bd0,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c32f;
    uStack_2bcc = 0;
    uStack_2bd0 = 0x3279656b;
    pfStack_2c68 = (fdb_config *)0x11c228;
    fVar2 = fdb_set_kv(pfStack_2c48,&uStack_2c20,0xb,&uStack_2bd0,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c334;
    pfStack_2c68 = (fdb_config *)0x11c23f;
    fVar2 = fdb_commit(pfStack_2c40,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c339;
    pfStack_2c68 = (fdb_config *)0x11c272;
    fVar2 = fdb_iterator_init(pfStack_2c48,&pfStack_2c50,&uStack_2c10,8,&uStack_2c30,9,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c33e;
    iVar8 = 0;
    pfVar7 = (fdb_config *)&pfStack_2c38;
    do {
      pfStack_2c38 = (fdb_doc *)0x0;
      pfStack_2c68 = (fdb_config *)0x11c297;
      fVar2 = fdb_iterator_get(pfStack_2c50,(fdb_doc **)pfVar7);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      iVar8 = iVar8 + 1;
      pfStack_2c68 = (fdb_config *)0x11c2a7;
      fdb_doc_free(pfStack_2c38);
      pfStack_2c68 = (fdb_config *)0x11c2b1;
      fVar2 = fdb_iterator_next(pfStack_2c50);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    if (iVar8 != 2) goto LAB_0011c343;
    pfStack_2c68 = (fdb_config *)0x11c2c8;
    fVar2 = fdb_iterator_close(pfStack_2c50);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c348;
    pfStack_2c68 = (fdb_config *)0x11c2d6;
    fVar2 = fdb_close(pfStack_2c40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c34d;
    pfStack_2c68 = (fdb_config *)0x11c2df;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_2c68 = (fdb_config *)0x11c2e8;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pfStack_2c68 = (fdb_config *)0x11c319;
      fprintf(_stderr,pcVar9,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_2c68 = (fdb_config *)0x11c32a;
    iterator_init_using_substring_test();
LAB_0011c32a:
    pfStack_2c68 = (fdb_config *)0x11c32f;
    iterator_init_using_substring_test();
LAB_0011c32f:
    pfStack_2c68 = (fdb_config *)0x11c334;
    iterator_init_using_substring_test();
LAB_0011c334:
    pfStack_2c68 = (fdb_config *)0x11c339;
    iterator_init_using_substring_test();
LAB_0011c339:
    pfStack_2c68 = (fdb_config *)0x11c33e;
    iterator_init_using_substring_test();
LAB_0011c33e:
    pfStack_2c68 = (fdb_config *)0x11c343;
    iterator_init_using_substring_test();
LAB_0011c343:
    pfStack_2c68 = (fdb_config *)0x11c348;
    iterator_init_using_substring_test();
LAB_0011c348:
    pfStack_2c68 = (fdb_config *)0x11c34d;
    iterator_init_using_substring_test();
LAB_0011c34d:
    pfStack_2c68 = (fdb_config *)0x11c352;
    iterator_init_using_substring_test();
  }
  pfStack_2c68 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_2dc0 = (fdb_config *)0x11c36d;
  pfStack_2c68 = pfVar7;
  gettimeofday(&tStack_2d70,(__timezone_ptr_t)0x0);
  pfStack_2dc0 = (fdb_config *)0x11c372;
  memleak_start();
  pfStack_2da8 = (fdb_iterator *)0x0;
  pfStack_2d98 = (fdb_doc *)0x0;
  pfVar7 = &fStack_2d60;
  pfStack_2dc0 = (fdb_config *)0x11c389;
  fdb_get_default_config();
  pfStack_2dc0 = (fdb_config *)0x11c393;
  fdb_get_default_kvs_config();
  pfStack_2dc0 = (fdb_config *)0x11c39f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_2dc0 = (fdb_config *)0x11c3b3;
  fVar2 = fdb_open(&pfStack_2d90,"./iterator_test1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_2dc0 = (fdb_config *)0x11c3cf;
    fVar2 = fdb_kvs_open_default(pfStack_2d90,&pfStack_2da0,&fStack_2d88);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c58c;
    pfStack_2dc0 = (fdb_config *)0x11c3f2;
    fdb_set_kv(pfStack_2da0,"A",1,(void *)0x0,0);
    pfVar7 = (fdb_config *)0x155dcc;
    pfStack_2dc0 = (fdb_config *)0x11c410;
    fdb_set_kv(pfStack_2da0,"B",1,(void *)0x0,0);
    pfStack_2dc0 = (fdb_config *)0x11c43b;
    fVar2 = fdb_iterator_init(pfStack_2da0,&pfStack_2da8,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c593;
    pfStack_2dc0 = (fdb_config *)0x11c44d;
    fVar2 = fdb_iterator_seek_to_max(pfStack_2da8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c598;
    pfStack_2dc0 = (fdb_config *)0x11c464;
    fVar2 = fdb_iterator_get(pfStack_2da8,&pfStack_2d98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c59f;
    if (*pfStack_2d98->key != 'B') goto LAB_0011c5a6;
    pfStack_2dc0 = (fdb_config *)0x11c483;
    fdb_doc_free(pfStack_2d98);
    pfStack_2d98 = (fdb_doc *)0x0;
    pfStack_2dc0 = (fdb_config *)0x11c496;
    fVar2 = fdb_iterator_close(pfStack_2da8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5ae;
    pfStack_2da8 = (fdb_iterator *)0x0;
    pfStack_2dc0 = (fdb_config *)0x11c4bd;
    fVar2 = fdb_del_kv(pfStack_2da0,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5b5;
    pfStack_2dc0 = (fdb_config *)0x11c4f4;
    fVar2 = fdb_iterator_init(pfStack_2da0,&pfStack_2da8,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5bc;
    pfStack_2dc0 = (fdb_config *)0x11c50b;
    fVar2 = fdb_iterator_get(pfStack_2da8,&pfStack_2d98);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c1;
    pfStack_2dc0 = (fdb_config *)0x11c51e;
    fVar2 = fdb_iterator_seek_to_max(pfStack_2da8);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c6;
    pfStack_2dc0 = (fdb_config *)0x11c531;
    fVar2 = fdb_close(pfStack_2d90);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c5cb;
    pfStack_2dc0 = (fdb_config *)0x11c53e;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_2dc0 = (fdb_config *)0x11c54b;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pfStack_2dc0 = (fdb_config *)0x11c57c;
      fprintf(_stderr,pcVar9,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_2dc0 = (fdb_config *)0x11c58c;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c58c:
    pfStack_2dc0 = (fdb_config *)0x11c593;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c593:
    pfStack_2dc0 = (fdb_config *)0x11c598;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c598:
    pfStack_2dc0 = (fdb_config *)0x11c59f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c59f:
    pfStack_2dc0 = (fdb_config *)0x11c5a6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5a6:
    pfStack_2dc0 = (fdb_config *)0x11c5ae;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5ae:
    pfStack_2dc0 = (fdb_config *)0x11c5b5;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5b5:
    pfStack_2dc0 = (fdb_config *)0x11c5bc;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5bc:
    pfStack_2dc0 = (fdb_config *)0x11c5c1;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c1:
    pfStack_2dc0 = (fdb_config *)0x11c5c6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c6:
    pfStack_2dc0 = (fdb_config *)0x11c5cb;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5cb:
    pfStack_2dc0 = (fdb_config *)0x11c5d2;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_2dc0 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_2dc0 = pfVar7;
  gettimeofday(&tStack_2ec8,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_2f00 = (fdb_iterator *)0x0;
  pfStack_2ee8 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar2 = fdb_open(&pfStack_2ef0,"./iterator_test1",&fStack_2eb8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_2ef0,&pfStack_2ef8,&fStack_2ee0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c779;
    fdb_set_kv(pfStack_2ef8,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_2ef8,"C",1,(void *)0x0,0);
    fVar2 = fdb_del_kv(pfStack_2ef8,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c780;
    fVar2 = fdb_iterator_init(pfStack_2ef8,&pfStack_2f00,"A",1,"B",1,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c787;
    fVar2 = fdb_iterator_get(pfStack_2f00,&pfStack_2ee8);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c78c;
    fVar2 = fdb_iterator_seek_to_min(pfStack_2f00);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c791;
    fVar2 = fdb_iterator_close(pfStack_2f00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c796;
    fVar2 = fdb_close(pfStack_2ef0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      if (fVar2 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar9,"iterator seek to min test");
        return;
      }
      goto LAB_0011c7a4;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c779:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c780:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c787:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c78c:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c791:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c796:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c7a4:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar8 = 0;
  do {
    delete_opt = 0;
    do {
      iterator_complete_test(iVar8,delete_opt);
      delete_opt = delete_opt + 1;
    } while (delete_opt == 1);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_offset_access_test()
{
    TEST_INIT();
    memleak_start();


    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *o_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status s;
    fdb_iterator *it;

    // remove  all previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 512;
    fconfig.buffercache_size = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    s = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, "DB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &o_db,"ODB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // set in offset verification index
        s = fdb_set_kv(o_db, keybuf, strlen(keybuf),
                        &doc[i]->offset, sizeof(uint64_t));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // delete some
     for (i=n/4;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        s = fdb_del_kv(db, (void*)keybuf, strlen(keybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // update initial n/4 docs
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k0y%d", i);
        sprintf(bodybuf, "b0dy%d", i);
        fdb_doc_free(doc[i]);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create iterator with no deletes
    fdb_iterator_init(o_db, &it, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);

    // only 2nd half of docs should exist at original offset
    for (i=n/2;i<n;i+=10){

        // get by offset
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // seek to in verificaiton db
        s = fdb_iterator_seek(it, doc[i]->key, doc[i]->keylen, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_iterator_get(it, &rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(*((uint64_t *)rdoc->body) == doc[i]->offset);

        // delete
        s = fdb_del(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // track new offset storing in doc[i]
        fdb_get_metaonly(db, doc[i]);
    }

    fdb_iterator_close(it);
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // do some sets passed recorded offset
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k1y%d", i);
        sprintf(bodybuf, "b1dy%d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // known offsets exist between n/2 - n
    for (i=n/2;i<n;i+=10){

        // verify can get by offset from main db
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_KEY_NOT_FOUND);

        // should be deleted now at new offset
        TEST_CHK(doc[i]->deleted == true);
    }

    for(i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_doc_free(rdoc);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator offset access test");
}